

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O1

bool __thiscall
DIS::MinefieldResponseNackPdu::operator==
          (MinefieldResponseNackPdu *this,MinefieldResponseNackPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pEVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = MinefieldFamilyPdu::operator==
                    (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar2 = EntityID::operator==(&this->_minefieldID,&rhs->_minefieldID);
  bVar3 = EntityID::operator==(&this->_requestingEntityID,&rhs->_requestingEntityID);
  bVar1 = this->_requestID == rhs->_requestID && (bVar3 && (bVar2 && bVar1));
  pEVar4 = (this->_missingPduSequenceNumbers).
           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_missingPduSequenceNumbers).
      super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar2 = EightByteChunk::operator==
                        ((EightByteChunk *)(pEVar4->_otherParameters + lVar5 + -8),
                         (EightByteChunk *)
                         (((rhs->_missingPduSequenceNumbers).
                           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_otherParameters + lVar5 + -8
                         ));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_missingPduSequenceNumbers).
               super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_missingPduSequenceNumbers).
                                   super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4));
  }
  return bVar1;
}

Assistant:

bool MinefieldResponseNackPdu::operator ==(const MinefieldResponseNackPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_requestingEntityID == rhs._requestingEntityID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _missingPduSequenceNumbers.size(); idx++)
     {
        if( ! ( _missingPduSequenceNumbers[idx] == rhs._missingPduSequenceNumbers[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }